

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::~QDebug(QDebug *this)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  int backtraceFrames;
  QInternalMessageLogContext ctxt;
  qsizetype in_stack_fffffffffffffe28;
  QMessageLogContext *in_stack_fffffffffffffe30;
  Stream *this_00;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QInternalMessageLogContext *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  QChar c;
  QMessageLogContext *this_01;
  undefined4 in_stack_fffffffffffffe60;
  QtMsgType in_stack_fffffffffffffe68;
  QChar local_14a;
  QMessageLogContext local_148 [10];
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_stack_fffffffffffffe48 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI != 0) &&
     (iVar2 = *(int *)(*in_RDI + 0x28) + -1, *(int *)(*in_RDI + 0x28) = iVar2, iVar2 == 0)) {
    if ((*(byte *)(*in_RDI + 0x30) & 1) != 0) {
      in_stack_fffffffffffffe68 = (int)*in_RDI + 0x10;
      QChar::QChar<char16_t,_true>(&local_14a,L' ');
      bVar1 = QString::endsWith((QString *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),c,
                                (CaseSensitivity)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      if (bVar1) {
        QString::chop((QString *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
    }
    if ((*(byte *)(*in_RDI + 0x32) & 1) != 0) {
      this_01 = local_148;
      memset(this_01,0xaa,0x140);
      QMessageLogContext::QMessageLogContext(this_01);
      std::optional<QVarLengthArray<void_*,_32LL>_>::optional
                ((optional<QVarLengthArray<void_*,_32LL>_> *)0x277542);
      iVar2 = QInternalMessageLogContext::initFrom
                        ((QInternalMessageLogContext *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         in_stack_fffffffffffffe30);
      if (iVar2 != 0) {
        QInternalMessageLogContext::populateBacktrace
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      }
      qt_message_output(in_stack_fffffffffffffe68,
                        (QMessageLogContext *)CONCAT44(iVar2,in_stack_fffffffffffffe60),
                        (QString *)this_01);
      QInternalMessageLogContext::~QInternalMessageLogContext
                ((QInternalMessageLogContext *)0x2775d8);
    }
    this_00 = (Stream *)*in_RDI;
    if (this_00 != (Stream *)0x0) {
      Stream::~Stream(this_00);
      operator_delete(this_00,0x58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDebug::~QDebug()
{
    if (stream && !--stream->ref) {
        if (stream->space && stream->buffer.endsWith(u' '))
            stream->buffer.chop(1);
        if (stream->message_output) {
            QInternalMessageLogContext ctxt(stream->context);
            qt_message_output(stream->type,
                              ctxt,
                              stream->buffer);
        }
        delete stream;
    }
}